

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase99::run(TestCase99 *this)

{
  return;
}

Assistant:

TEST(UnitMeasure, BoundedConst) {
  // TODO(someday): Some script should attempt to compile this test once with each "COMPILE ERROR"
  //   line restored to verify that they actually error out.

  KJ_EXPECT((bounded<456>() + bounded<123>()).unwrap() == 456 + 123);
  KJ_EXPECT((bounded<456>() - bounded<123>()).unwrap() == 456 - 123);
  KJ_EXPECT((bounded<456>() * bounded<123>()).unwrap() == 456 * 123);
  KJ_EXPECT((bounded<456>() / bounded<123>()).unwrap() == 456 / 123);
  KJ_EXPECT((bounded<456>() % bounded<123>()).unwrap() == 456 % 123);
  KJ_EXPECT((bounded<456>() << bounded<5>()).unwrap() == 456 << 5);
  KJ_EXPECT((bounded<456>() >> bounded<2>()).unwrap() == 456 >> 2);

  KJ_EXPECT(bounded<123>() == bounded<123>());
  KJ_EXPECT(bounded<123>() != bounded<456>());
  KJ_EXPECT(bounded<123>() <  bounded<456>());
  KJ_EXPECT(bounded<456>() >  bounded<123>());
  KJ_EXPECT(bounded<123>() <= bounded<456>());
  KJ_EXPECT(bounded<456>() >= bounded<123>());

  KJ_EXPECT(!(bounded<123>() == bounded<456>()));
  KJ_EXPECT(!(bounded<123>() != bounded<123>()));
  KJ_EXPECT(!(bounded<456>() <  bounded<123>()));
  KJ_EXPECT(!(bounded<123>() >  bounded<456>()));
  KJ_EXPECT(!(bounded<456>() <= bounded<123>()));
  KJ_EXPECT(!(bounded<123>() >= bounded<456>()));

  {
    uint16_t succ = unbound(bounded<12345>());
    KJ_EXPECT(succ == 12345);

    // COMPILE ERROR: uint8_t err KJ_UNUSED = unbound(bounded<12345>());
  }

  // COMPILE ERROR: auto err1 KJ_UNUSED = bounded<(0xffffffffffffffffull)>() + bounded<1>();
  // COMPILE ERROR: auto err2 KJ_UNUSED = bounded<1>() - bounded<2>();
  // COMPILE ERROR: auto err3 KJ_UNUSED = bounded<(1ull << 60)>() * bounded<(1ull << 60)>();
  // COMPILE ERROR: auto err4 KJ_UNUSED = bounded<1>() / bounded<0>();
  // COMPILE ERROR: auto err5 KJ_UNUSED = bounded<1>() % bounded<0>();
  // COMPILE ERROR: auto err6 KJ_UNUSED = bounded<1>() << bounded<64>();
  // COMPILE ERROR: auto err7 KJ_UNUSED = bounded<(1ull << 60)>() << bounded<4>();
  // COMPILE ERROR: auto err8 KJ_UNUSED = bounded<1>() >> bounded<64>();

  // COMPILE ERROR: boundedAdd<0xffffffffffffffffull, 1>();
  // COMPILE ERROR: boundedSub<1, 2>();
  // COMPILE ERROR: boundedMul<0x100000000, 0x100000000>();
  // COMPILE ERROR: boundedLShift<0x10, 60>();
}